

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O0

CURLcode ftp_done(connectdata *conn,CURLcode status,_Bool premature)

{
  undefined8 uVar1;
  ssize_t sVar2;
  FTP *data_00;
  char *pcVar3;
  curltime cVar4;
  size_t local_88;
  undefined4 uStack_6c;
  long old_time;
  size_t pathLen;
  char *rawPath;
  CURLcode result;
  int ftpcode;
  ssize_t nread;
  pingpong *pp;
  ftp_conn *ftpc;
  FTP *ftp;
  Curl_easy *data;
  _Bool premature_local;
  connectdata *pcStack_18;
  CURLcode status_local;
  connectdata *conn_local;
  
  ftp = (FTP *)conn->data;
  ftpc = (ftp_conn *)(((Curl_easy *)ftp)->req).protop;
  nread = (ssize_t)&conn->proto;
  rawPath._0_4_ = CURLE_OK;
  pathLen = 0;
  old_time = 0;
  if (ftpc == (ftp_conn *)0x0) {
    return CURLE_OK;
  }
  pp = (pingpong *)nread;
  data._3_1_ = premature;
  data._4_4_ = status;
  pcStack_18 = conn;
  switch(status) {
  case CURLE_OK:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_PARTIAL_FILE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_WRITE_ERROR:
  case CURLE_UPLOAD_FAILED:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
    if (!premature) goto LAB_0011cd78;
  }
  (conn->proto).ftpc.ctl_valid = false;
  (conn->proto).ftpc.cwdfail = true;
  Curl_conncontrol(conn,1);
  rawPath._0_4_ = data._4_4_;
LAB_0011cd78:
  if ((*(ushort *)((long)&ftp[0xb0].pathalloc + 4) >> 7 & 1) != 0) {
    if ((ftp[0x75].path != (char *)0x0) && (pp[1].linestart_resp != (char *)0x0)) {
      Curl_set_in_callback((Curl_easy *)ftp,true);
      (*(code *)ftp[0x75].path)(ftp[0xb2].downloadsize);
      Curl_set_in_callback((Curl_easy *)ftp,false);
    }
    pp[1].statemach_act = (_func_CURLcode_connectdata_ptr *)0xffffffffffffffff;
  }
  if ((CURLcode)rawPath == CURLE_OK) {
    rawPath._0_4_ =
         Curl_urldecode((Curl_easy *)ftp,(ftpc->pp).cache,0,(char **)&pathLen,(size_t *)&old_time,
                        true);
  }
  if ((CURLcode)rawPath == CURLE_OK) {
    if (((int)ftp[0x5e].downloadsize == 2) && (*(char *)pathLen == '/')) {
      (*Curl_cfree)((void *)pathLen);
    }
    else {
      (*Curl_cfree)((void *)pp[1].sendleft);
      if (((ulong)pp[1].sendthis & 1) == 0) {
        if ((int)ftp[0x5e].downloadsize == 2) {
          old_time = 0;
        }
        else {
          if (pp[1].linestart_resp == (char *)0x0) {
            local_88 = 0;
          }
          else {
            local_88 = strlen(pp[1].linestart_resp);
          }
          old_time = old_time - local_88;
        }
        *(undefined1 *)(pathLen + old_time) = 0;
        pp[1].sendleft = pathLen;
      }
      else {
        (*Curl_cfree)((void *)pathLen);
        pp[1].sendleft = 0;
      }
    }
    if (pp[1].sendleft != 0) {
      Curl_infof((Curl_easy *)ftp,"Remembering we are in dir \"%s\"\n",pp[1].sendleft);
    }
  }
  else {
    pp[1].field_0x21 = 0;
    Curl_conncontrol(pcStack_18,1);
    (*Curl_cfree)((void *)pp[1].sendleft);
    pp[1].sendleft = 0;
  }
  freedirs((ftp_conn *)pp);
  if (pcStack_18->sock[1] != -1) {
    if (((((CURLcode)rawPath == CURLE_OK) && ((pp[1].pending_resp & 1U) != 0)) &&
        (0 < (long)ftp[7].path)) &&
       (rawPath._0_4_ = Curl_pp_sendf((pingpong *)nread,"%s","ABOR"), data_00 = ftp,
       (CURLcode)rawPath != CURLE_OK)) {
      pcVar3 = curl_easy_strerror((CURLcode)rawPath);
      Curl_failf((Curl_easy *)data_00,"Failure sending ABOR command: %s",pcVar3);
      pp[1].field_0x21 = 0;
      Curl_conncontrol(pcStack_18,1);
    }
    if ((pcStack_18->ssl[1].field_0x10 & 1) != 0) {
      Curl_ssl_close(pcStack_18,1);
    }
    close_secondarysocket(pcStack_18);
  }
  sVar2 = nread;
  if ((((CURLcode)rawPath == CURLE_OK) && ((int)(ftpc->pp).nread_resp == 0)) &&
     (((pp[1].field_0x21 & 1) != 0 &&
      (((*(byte *)(nread + 0x20) & 1) != 0 && ((data._3_1_ & 1) == 0)))))) {
    uVar1 = *(undefined8 *)(nread + 0x50);
    *(undefined8 *)(nread + 0x50) = 60000;
    cVar4 = Curl_now();
    *(time_t *)(sVar2 + 0x40) = cVar4.tv_sec;
    *(ulong *)(sVar2 + 0x48) = CONCAT44(uStack_6c,cVar4.tv_usec);
    rawPath._0_4_ = Curl_GetFTPResponse((ssize_t *)&result,pcStack_18,(int *)((long)&rawPath + 4));
    *(undefined8 *)(nread + 0x50) = uVar1;
    if ((_result == 0) && ((CURLcode)rawPath == CURLE_OPERATION_TIMEDOUT)) {
      Curl_failf((Curl_easy *)ftp,"control connection looks dead");
      pp[1].field_0x21 = 0;
      Curl_conncontrol(pcStack_18,1);
    }
    if ((CURLcode)rawPath != CURLE_OK) {
      return (CURLcode)rawPath;
    }
    if (((pp[1].pending_resp & 1U) != 0) && (0 < (long)ftp[7].path)) {
      Curl_infof((Curl_easy *)ftp,"partial download completed, closing connection\n");
      Curl_conncontrol(pcStack_18,1);
      return (CURLcode)rawPath;
    }
    if ((((pp[1].pending_resp & 1U) == 0) && (rawPath._4_4_ != 0xe2)) && (rawPath._4_4_ != 0xfa)) {
      Curl_failf((Curl_easy *)ftp,"server did not report OK, got %d",(ulong)rawPath._4_4_);
      rawPath._0_4_ = CURLE_PARTIAL_FILE;
    }
  }
  if (((CURLcode)rawPath == CURLE_OK) && ((data._3_1_ & 1) == 0)) {
    if (((ulong)ftp[0x79].downloadsize >> 0x1d & 1) == 0) {
      if (((ftp[6].downloadsize == -1) || ((char *)ftp[6].downloadsize == ftp[7].pathalloc)) ||
         (((char *)(ftp[6].downloadsize + *(long *)&ftp[0xaa].transfer) == ftp[7].pathalloc ||
          (ftp[7].path == ftp[7].pathalloc)))) {
        if ((((pp[1].pending_resp & 1U) == 0) && (ftp[7].pathalloc == (char *)0x0)) &&
           (0 < ftp[6].downloadsize)) {
          Curl_failf((Curl_easy *)ftp,"No data was received!");
          rawPath._0_4_ = CURLE_FTP_COULDNT_RETR_FILE;
        }
      }
      else {
        Curl_failf((Curl_easy *)ftp,"Received only partial file: %ld bytes",ftp[7].pathalloc);
        rawPath._0_4_ = CURLE_PARTIAL_FILE;
      }
    }
    else if (((ftp[0xac].path != (char *)0xffffffffffffffff) &&
             (ftp[0xac].path != *(char **)&ftp[7].transfer)) &&
            ((((ulong)ftp[0x79].downloadsize >> 6 & 1) == 0 && ((int)(ftpc->pp).nread_resp == 0))))
    {
      Curl_failf((Curl_easy *)ftp,"Uploaded unaligned file size (%ld out of %ld bytes)",
                 ftp[7].pathalloc,ftp[0xac].path);
      rawPath._0_4_ = CURLE_PARTIAL_FILE;
    }
  }
  *(undefined4 *)&(ftpc->pp).nread_resp = 0;
  pp[1].pending_resp = false;
  if (((data._4_4_ == CURLE_OK) && ((CURLcode)rawPath == CURLE_OK)) &&
     (((data._3_1_ & 1) == 0 && (*(long *)&ftp[0x4e].transfer != 0)))) {
    rawPath._0_4_ = ftp_sendquote(pcStack_18,*(curl_slist **)&ftp[0x4e].transfer);
  }
  (*Curl_cfree)((void *)(ftpc->pp).cache_size);
  (ftpc->pp).cache_size = 0;
  return (CURLcode)rawPath;
}

Assistant:

static CURLcode ftp_done(struct connectdata *conn, CURLcode status,
                         bool premature)
{
  struct Curl_easy *data = conn->data;
  struct FTP *ftp = data->req.protop;
  struct ftp_conn *ftpc = &conn->proto.ftpc;
  struct pingpong *pp = &ftpc->pp;
  ssize_t nread;
  int ftpcode;
  CURLcode result = CURLE_OK;
  char *rawPath = NULL;
  size_t pathLen = 0;

  if(!ftp)
    return CURLE_OK;

  switch(status) {
  case CURLE_BAD_DOWNLOAD_RESUME:
  case CURLE_FTP_WEIRD_PASV_REPLY:
  case CURLE_FTP_PORT_FAILED:
  case CURLE_FTP_ACCEPT_FAILED:
  case CURLE_FTP_ACCEPT_TIMEOUT:
  case CURLE_FTP_COULDNT_SET_TYPE:
  case CURLE_FTP_COULDNT_RETR_FILE:
  case CURLE_PARTIAL_FILE:
  case CURLE_UPLOAD_FAILED:
  case CURLE_REMOTE_ACCESS_DENIED:
  case CURLE_FILESIZE_EXCEEDED:
  case CURLE_REMOTE_FILE_NOT_FOUND:
  case CURLE_WRITE_ERROR:
    /* the connection stays alive fine even though this happened */
    /* fall-through */
  case CURLE_OK: /* doesn't affect the control connection's status */
    if(!premature)
      break;

    /* until we cope better with prematurely ended requests, let them
     * fallback as if in complete failure */
    /* FALLTHROUGH */
  default:       /* by default, an error means the control connection is
                    wedged and should not be used anymore */
    ftpc->ctl_valid = FALSE;
    ftpc->cwdfail = TRUE; /* set this TRUE to prevent us to remember the
                             current path, as this connection is going */
    connclose(conn, "FTP ended with bad error code");
    result = status;      /* use the already set error code */
    break;
  }

  if(data->state.wildcardmatch) {
    if(data->set.chunk_end && ftpc->file) {
      Curl_set_in_callback(data, true);
      data->set.chunk_end(data->wildcard.customptr);
      Curl_set_in_callback(data, false);
    }
    ftpc->known_filesize = -1;
  }

  if(!result)
    /* get the url-decoded "raw" path */
    result = Curl_urldecode(data, ftp->path, 0, &rawPath, &pathLen, TRUE);
  if(result) {
    /* We can limp along anyway (and should try to since we may already be in
     * the error path) */
    ftpc->ctl_valid = FALSE; /* mark control connection as bad */
    connclose(conn, "FTP: out of memory!"); /* mark for connection closure */
    free(ftpc->prevpath);
    ftpc->prevpath = NULL; /* no path remembering */
  }
  else { /* remember working directory for connection reuse */
    if((data->set.ftp_filemethod == FTPFILE_NOCWD) && (rawPath[0] == '/'))
      free(rawPath); /* full path => no CWDs happened => keep ftpc->prevpath */
    else {
      free(ftpc->prevpath);

      if(!ftpc->cwdfail) {
        if(data->set.ftp_filemethod == FTPFILE_NOCWD)
          pathLen = 0; /* relative path => working directory is FTP home */
        else
          pathLen -= ftpc->file?strlen(ftpc->file):0; /* file is url-decoded */

        rawPath[pathLen] = '\0';
        ftpc->prevpath = rawPath;
      }
      else {
        free(rawPath);
        ftpc->prevpath = NULL; /* no path */
      }
    }

    if(ftpc->prevpath)
      infof(data, "Remembering we are in dir \"%s\"\n", ftpc->prevpath);
  }

  /* free the dir tree and file parts */
  freedirs(ftpc);

  /* shut down the socket to inform the server we're done */

#ifdef _WIN32_WCE
  shutdown(conn->sock[SECONDARYSOCKET], 2);  /* SD_BOTH */
#endif

  if(conn->sock[SECONDARYSOCKET] != CURL_SOCKET_BAD) {
    if(!result && ftpc->dont_check && data->req.maxdownload > 0) {
      /* partial download completed */
      result = Curl_pp_sendf(pp, "%s", "ABOR");
      if(result) {
        failf(data, "Failure sending ABOR command: %s",
              curl_easy_strerror(result));
        ftpc->ctl_valid = FALSE; /* mark control connection as bad */
        connclose(conn, "ABOR command failed"); /* connection closure */
      }
    }

    if(conn->ssl[SECONDARYSOCKET].use) {
      /* The secondary socket is using SSL so we must close down that part
         first before we close the socket for real */
      Curl_ssl_close(conn, SECONDARYSOCKET);

      /* Note that we keep "use" set to TRUE since that (next) connection is
         still requested to use SSL */
    }
    close_secondarysocket(conn);
  }

  if(!result && (ftp->transfer == FTPTRANSFER_BODY) && ftpc->ctl_valid &&
     pp->pending_resp && !premature) {
    /*
     * Let's see what the server says about the transfer we just performed,
     * but lower the timeout as sometimes this connection has died while the
     * data has been transferred. This happens when doing through NATs etc that
     * abandon old silent connections.
     */
    long old_time = pp->response_time;

    pp->response_time = 60*1000; /* give it only a minute for now */
    pp->response = Curl_now(); /* timeout relative now */

    result = Curl_GetFTPResponse(&nread, conn, &ftpcode);

    pp->response_time = old_time; /* set this back to previous value */

    if(!nread && (CURLE_OPERATION_TIMEDOUT == result)) {
      failf(data, "control connection looks dead");
      ftpc->ctl_valid = FALSE; /* mark control connection as bad */
      connclose(conn, "Timeout or similar in FTP DONE operation"); /* close */
    }

    if(result)
      return result;

    if(ftpc->dont_check && data->req.maxdownload > 0) {
      /* we have just sent ABOR and there is no reliable way to check if it was
       * successful or not; we have to close the connection now */
      infof(data, "partial download completed, closing connection\n");
      connclose(conn, "Partial download with no ability to check");
      return result;
    }

    if(!ftpc->dont_check) {
      /* 226 Transfer complete, 250 Requested file action okay, completed. */
      if((ftpcode != 226) && (ftpcode != 250)) {
        failf(data, "server did not report OK, got %d", ftpcode);
        result = CURLE_PARTIAL_FILE;
      }
    }
  }

  if(result || premature)
    /* the response code from the transfer showed an error already so no
       use checking further */
    ;
  else if(data->set.upload) {
    if((-1 != data->state.infilesize) &&
       (data->state.infilesize != data->req.writebytecount) &&
       !data->set.crlf &&
       (ftp->transfer == FTPTRANSFER_BODY)) {
      failf(data, "Uploaded unaligned file size (%" CURL_FORMAT_CURL_OFF_T
            " out of %" CURL_FORMAT_CURL_OFF_T " bytes)",
            data->req.bytecount, data->state.infilesize);
      result = CURLE_PARTIAL_FILE;
    }
  }
  else {
    if((-1 != data->req.size) &&
       (data->req.size != data->req.bytecount) &&
#ifdef CURL_DO_LINEEND_CONV
       /* Most FTP servers don't adjust their file SIZE response for CRLFs, so
        * we'll check to see if the discrepancy can be explained by the number
        * of CRLFs we've changed to LFs.
        */
       ((data->req.size + data->state.crlf_conversions) !=
        data->req.bytecount) &&
#endif /* CURL_DO_LINEEND_CONV */
       (data->req.maxdownload != data->req.bytecount)) {
      failf(data, "Received only partial file: %" CURL_FORMAT_CURL_OFF_T
            " bytes", data->req.bytecount);
      result = CURLE_PARTIAL_FILE;
    }
    else if(!ftpc->dont_check &&
            !data->req.bytecount &&
            (data->req.size>0)) {
      failf(data, "No data was received!");
      result = CURLE_FTP_COULDNT_RETR_FILE;
    }
  }

  /* clear these for next connection */
  ftp->transfer = FTPTRANSFER_BODY;
  ftpc->dont_check = FALSE;

  /* Send any post-transfer QUOTE strings? */
  if(!status && !result && !premature && data->set.postquote)
    result = ftp_sendquote(conn, data->set.postquote);
  Curl_safefree(ftp->pathalloc);
  return result;
}